

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

Aig_Obj_t * Aig_ObjCreateCo(Aig_Man_t *p,Aig_Obj_t *pDriver)

{
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pDriver_local;
  Aig_Man_t *p_local;
  
  pObj_00 = Aig_ManFetchMemory(p);
  *(ulong *)&pObj_00->field_0x18 = *(ulong *)&pObj_00->field_0x18 & 0xfffffffffffffff8 | 3;
  Vec_PtrPush(p->vCos,pObj_00);
  Aig_ObjConnect(p,pObj_00,pDriver,(Aig_Obj_t *)0x0);
  p->nObjs[3] = p->nObjs[3] + 1;
  return pObj_00;
}

Assistant:

Aig_Obj_t * Aig_ObjCreateCo( Aig_Man_t * p, Aig_Obj_t * pDriver )
{
    Aig_Obj_t * pObj;
    pObj = Aig_ManFetchMemory( p );
    pObj->Type = AIG_OBJ_CO;
    Vec_PtrPush( p->vCos, pObj );
    Aig_ObjConnect( p, pObj, pDriver, NULL );
    p->nObjs[AIG_OBJ_CO]++;
    return pObj;
}